

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O0

int testDatumArrayConversions(void)

{
  int iVar1;
  VRInt VVar2;
  reference pvVar3;
  reference pvVar4;
  VRDatumConverter<MinVR::VRDatum> this;
  reference pvVar5;
  VRFloatArray g;
  VRDatumFloat f;
  VRIntArray e;
  VRDatumInt d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c;
  string b;
  VRDatumString a;
  int loopctr;
  int out;
  undefined4 in_stack_fffffffffffffd48;
  VRFloat in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  VRFloat in_stack_fffffffffffffd54;
  VRDatumConverter<MinVR::VRDatum> in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd80;
  VRCORETYPE_ID in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  VRDatumConverter<MinVR::VRDatum> in_stack_fffffffffffffd90;
  vector<float,_std::allocator<float>_> local_240 [5];
  VRDatum_conflict *local_1c0;
  VRDatum_conflict *local_1b8;
  vector<int,_std::allocator<int>_> local_1b0 [5];
  string local_130 [32];
  VRDatum_conflict *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  VRDatum_conflict *local_f0;
  string local_e8 [32];
  string local_c8 [55];
  allocator<char> local_91;
  string local_90 [32];
  VRDatum local_70;
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd90.datum,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               (allocator<char> *)in_stack_fffffffffffffd80);
    MinVR::VRDatumString::VRDatumString
              ((VRDatumString *)in_stack_fffffffffffffd90.datum,
               (VRString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    MinVR::VRDatum::getDescription_abi_cxx11_
              ((VRDatum *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_4 = std::__cxx11::string::compare((char *)local_c8);
    std::__cxx11::string::~string(local_c8);
    local_f0 = (VRDatum_conflict *)
               MinVR::
               VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
               ::getValue((VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                           *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    MinVR::VRDatumConverter::operator_cast_to_string
              ((VRDatumConverter<MinVR::VRDatum> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd90 =
         MinVR::
         VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
         ::getValue((VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
                     *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_110 = in_stack_fffffffffffffd90.datum;
    MinVR::VRDatumConverter::operator_cast_to_vector
              ((VRDatumConverter<MinVR::VRDatum> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_108,0);
    in_stack_fffffffffffffd8c = std::__cxx11::string::compare((string *)pvVar3);
    local_4 = local_4 + in_stack_fffffffffffffd8c;
    in_stack_fffffffffffffd88 = MinVR::VRDatum::getType(&local_70);
    local_4 = local_4 + (uint)(in_stack_fffffffffffffd88 != VRCORETYPE_STRING);
    MinVR::VRDatumString::getValueString_abi_cxx11_
              ((VRDatumString *)in_stack_fffffffffffffd58.datum);
    in_stack_fffffffffffffd80 = local_130;
    iVar1 = std::__cxx11::string::compare((char *)in_stack_fffffffffffffd80);
    local_4 = local_4 + iVar1;
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    MinVR::VRDatumInt::VRDatumInt
              ((VRDatumInt *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (VRInt)in_stack_fffffffffffffd4c);
    local_1b8 = (VRDatum_conflict *)
                MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::getValue
                          ((VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *)
                           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    MinVR::VRDatumConverter::operator_cast_to_vector
              ((VRDatumConverter<MinVR::VRDatum> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_1b0,0);
    iVar1 = *pvVar4;
    local_1c0 = (VRDatum_conflict *)
                MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::getValue
                          ((VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *)
                           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    VVar2 = MinVR::VRDatumConverter::operator_cast_to_int
                      ((VRDatumConverter<MinVR::VRDatum> *)0x10b922);
    local_4 = local_4 + (uint)(iVar1 != VVar2);
    MinVR::VRDatumFloat::VRDatumFloat
              ((VRDatumFloat *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c);
    this = MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::getValue
                     ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    MinVR::VRDatumConverter::operator_cast_to_vector
              ((VRDatumConverter<MinVR::VRDatum> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd58 =
         MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::getValue
                   ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)
                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd54 =
         MinVR::VRDatumConverter::operator_cast_to_float
                   ((VRDatumConverter<MinVR::VRDatum> *)0x10b9b6);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_240,0);
    *pvVar5 = in_stack_fffffffffffffd54;
    local_4 = (uint)(in_stack_fffffffffffffd54 == 0.0) + local_4;
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)this.datum);
    MinVR::VRDatumFloat::~VRDatumFloat((VRDatumFloat *)0x10ba15);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this.datum)
    ;
    MinVR::VRDatumInt::~VRDatumInt((VRDatumInt *)0x10ba2f);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this.datum);
    std::__cxx11::string::~string(local_e8);
    MinVR::VRDatumString::~VRDatumString((VRDatumString *)0x10ba56);
  }
  return local_4;
}

Assistant:

int testDatumArrayConversions() {

  int out = 0;

  LOOP {

    MinVR::VRDatumString a = MinVR::VRDatumString(std::string("this is a string"));

    out = a.getDescription().compare("string");

    std::string b = a.getValue();

    std::vector<std::string> c = a.getValue();

    out += c[0].compare(b);

    out += (a.getType() == MinVR::VRCORETYPE_STRING) ? 0 : 1;

    out += a.getValueString().compare("this is a string");

    MinVR::VRDatumInt d = MinVR::VRDatumInt(37);

    MinVR::VRIntArray e = d.getValue();

    out += (e[0] == (MinVR::VRInt)d.getValue()) ? 0 : 1;

    MinVR::VRDatumFloat f = MinVR::VRDatumFloat(3.1415926f);

    MinVR::VRFloatArray g = f.getValue();

    out += (g[0] = (MinVR::VRFloat)f.getValue()) ? 0 : 1;

  }